

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Serializer.cpp
# Opt level: O3

void __thiscall
ser::Serializer::WriteField
          (Serializer *this,string *fieldName,Savepoint *savepoint,void *pData,int iStride,
          int jStride,int kStride,int lStride)

{
  OffsetTable *this_00;
  StellaOutputProxy *pSVar1;
  ostream *poVar2;
  SerializationException *pSVar3;
  int local_2ac;
  string checksum;
  vector<char,_std::allocator<char>_> binaryData;
  offset_t offset;
  void *pData_local;
  DataFieldInfo *local_238;
  ostringstream errorstr;
  char local_220 [496];
  
  if (enabled_ < 0) {
    return;
  }
  pData_local = pData;
  stella::detail::StellaOutput::operator<<((StellaOutput *)&checksum,(char (*) [15])&sout);
  pSVar1 = stella::detail::StellaOutputProxy::operator<<((StellaOutputProxy *)&checksum,fieldName);
  pSVar1 = stella::detail::StellaOutputProxy::operator<<(pSVar1,(char (*) [15])0x12cb3c);
  Savepoint::ToString_abi_cxx11_((string *)&errorstr,savepoint);
  pSVar1 = stella::detail::StellaOutputProxy::operator<<
                     (pSVar1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &errorstr);
  pSVar1 = stella::detail::StellaOutputProxy::operator<<(pSVar1,(char (*) [15])" with data at ");
  pSVar1 = stella::detail::StellaOutputProxy::operator<<(pSVar1,&pData_local);
  stella::detail::StellaOutputProxy::operator<<(pSVar1,(char (*) [2])0x12c552);
  if (_errorstr != local_220) {
    operator_delete(_errorstr);
  }
  if (this->mode_ - SerializerOpenModeWrite < 2) {
    local_238 = FieldsTable::Find(&this->fieldsTable_,fieldName);
    this_00 = &this->offsetTable_;
    local_2ac = OffsetTable::GetSavepointID(this_00,savepoint);
    if (local_2ac < 0) {
      local_2ac = OffsetTable::AddNewSavepoint(this_00,savepoint,-1);
    }
    OffsetTable::GetOffset(this_00,local_2ac,fieldName);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&errorstr);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&errorstr,"Error: field ",0xd);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&errorstr,(fieldName->_M_dataplus)._M_p,
                        fieldName->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," was already saved into ",0x18);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"serializer at savepoint ",0x18);
    Savepoint::ToString_abi_cxx11_(&checksum,savepoint);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar2,checksum._M_dataplus._M_p,checksum._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)checksum._M_dataplus._M_p != &checksum.field_2) {
      operator_delete(checksum._M_dataplus._M_p);
    }
    checksum._M_string_length = (long)&checksum.field_2 + 8;
    checksum._M_dataplus._M_p = (pointer)&PTR__SerializationException_001378f0;
    checksum.field_2._M_allocated_capacity = 0;
    checksum.field_2._M_local_buf[8] = '\0';
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::_M_assign((string *)&checksum._M_string_length);
    if ((pointer *)
        binaryData.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start !=
        &binaryData.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage) {
      operator_delete(binaryData.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    pSVar3 = (SerializationException *)__cxa_allocate_exception(0x28);
    SerializationException::SerializationException(pSVar3,(SerializationException *)&checksum);
    __cxa_throw(pSVar3,&SerializationException::typeinfo,
                SerializationException::~SerializationException);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&errorstr);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&errorstr,
             "Error: serializer not open in write mode, but write operation requested.",0x48);
  checksum._M_string_length = (long)&checksum.field_2 + 8;
  checksum._M_dataplus._M_p = (pointer)&PTR__SerializationException_001378f0;
  checksum.field_2._M_allocated_capacity = 0;
  checksum.field_2._M_local_buf[8] = '\0';
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::_M_assign((string *)&checksum._M_string_length);
  if ((pointer *)
      binaryData.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      &binaryData.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage) {
    operator_delete(binaryData.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  pSVar3 = (SerializationException *)__cxa_allocate_exception(0x28);
  SerializationException::SerializationException(pSVar3,(SerializationException *)&checksum);
  __cxa_throw(pSVar3,&SerializationException::typeinfo,
              SerializationException::~SerializationException);
}

Assistant:

void Serializer::WriteField(const std::string& fieldName, const Savepoint& savepoint,
        const void* pData, int iStride, int jStride, int kStride, int lStride)
{
    // Don't write if serialization is disabeld
    if (enabled_ < 0) return;

    sout << "Writing field " << fieldName << " at savepoint " << savepoint.ToString()
         << " with data at " << pData << "\n";

    // Check open mode
    if (mode_ != SerializerOpenModeWrite && mode_ != SerializerOpenModeAppend)
    {
        // Throw exception
        std::ostringstream errorstr;
        errorstr << "Error: serializer not open in write mode, but write operation requested.";
        SerializationException exception;
        exception.Init(errorstr.str());
        throw exception;
    }

    // Retrieve field info
    // (It will throw an exception if the field is not yet registered)
    const DataFieldInfo& info = fieldsTable_.Find(fieldName);

    // Search savepoint or add a new one if not present
    int savepointID = offsetTable_.GetSavepointID(savepoint);
    if (savepointID < 0)
        savepointID = offsetTable_.AddNewSavepoint(savepoint);

    // Check if field is already saved at savepoint
    try
    {
        offsetTable_.GetOffset(savepointID, fieldName);

        // Field is already there: throw exception
        std::ostringstream errorstr;
        errorstr << "Error: field " << fieldName << " was already saved into "
            << "serializer at savepoint " << savepoint.ToString();
        SerializationException exception;
        exception.Init(errorstr.str());
        throw exception;
    }
    catch (SerializationException&)
    {
        // Field is not there (or savepoint does not exist)
        // No error, continue
    }

    // Obtain buffer and checksum
    std::vector<char> binaryData;
    const std::string checksum = binarySerializer_.WriteArray(pData, info.bytesPerElement(),
            info.iSize(), info.jSize(), info.kSize(), info.lSize(),
            iStride, jStride, kStride, lStride, binaryData);

    // Check in offset table if data must be stored
    OffsetTable::offset_t offset;
    if (!offsetTable_.AlreadySerialized(fieldName, checksum, offset))
    {
        // Record is not found: we need to write the data
        // Open file stream
        std::ofstream fs;
        offset = pFileFormat_->OpenStreamAppend(fs, fieldName, savepoint);

        // Write data and close stream
        fs.write(binaryData.data(), binaryData.size());
        fs.close();
    }

    // Update tables
    offsetTable_.AddFieldRecord(savepointID, fieldName, offset, checksum);
    pFileFormat_->WriteTables(fieldName);
}